

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O1

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::get(application_specific_pool *this,service *srv)

{
  int iVar1;
  service *psVar2;
  pointer psVar3;
  intrusive_ptr<cppcms::application> iVar4;
  application *tmp;
  unique_lock<std::recursive_mutex> g;
  intrusive_ptr<cppcms::application> local_38;
  unique_lock<std::recursive_mutex> local_30;
  intrusive_ptr<cppcms::application> local_20;
  
  psVar2 = srv[3].impl_.ptr_;
  iVar1 = *(int *)&(psVar2->io_service_)._M_t.
                   super___uniq_ptr_impl<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_booster::aio::io_service_*,_std::default_delete<booster::aio::io_service>_>
                   .super__Head_base<0UL,_booster::aio::io_service_*,_false>;
  this->_vptr_application_specific_pool = (_func_int **)0x0;
  if (iVar1 != -1) {
    psVar3 = (psVar2->acceptors_).
             super__Vector_base<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (*(char *)&(psVar3->
                  super___shared_ptr<cppcms::impl::cgi::acceptor,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi == '\x01') {
      local_30._M_device =
           (mutex_type *)
           &(psVar2->acceptors_).
            super__Vector_base<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_30._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&local_30);
      local_30._M_owns = true;
      (*(code *)((((srv[3].impl_.ptr_)->acceptors_).
                  super__Vector_base<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<cppcms::impl::cgi::acceptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [5]._vptr_acceptor)(&local_20);
      iVar4.p_ = local_20.p_;
      local_20.p_ = (application *)0x0;
      local_38.p_ = (application *)this->_vptr_application_specific_pool;
      this->_vptr_application_specific_pool = (_func_int **)iVar4.p_;
      booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_38);
      booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_20);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
    }
    else {
      (*(code *)(psVar3->super___shared_ptr<cppcms::impl::cgi::acceptor,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr[5]._vptr_acceptor)(&local_38);
      iVar4.p_ = local_38.p_;
      local_38.p_ = (application *)0x0;
      local_30._M_device = (mutex_type *)this->_vptr_application_specific_pool;
      this->_vptr_application_specific_pool = (_func_int **)iVar4.p_;
      booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
                ((intrusive_ptr<cppcms::application> *)&local_30);
      booster::intrusive_ptr<cppcms::application>::~intrusive_ptr(&local_38);
    }
  }
  return (intrusive_ptr<cppcms::application>)(application *)this;
}

Assistant:

booster::intrusive_ptr<application> application_specific_pool::get(cppcms::service &srv)
{

	if(d->flags == -1)
		return 0;
	assert(d->policy.get());
	booster::intrusive_ptr<application> app;

	if(d->policy->lock_on_get_put) {
		booster::unique_lock<booster::recursive_mutex> g(d->lock);
		app = d->policy->get(srv);
	}
	else
		app = d->policy->get(srv);
	return app;
}